

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeRegistry.h
# Opt level: O0

bool __thiscall
anurbs::TypeEntry<anurbs::Polyline<2L>,_anurbs::Model>::load
          (TypeEntry<anurbs::Polyline<2L>,_anurbs::Model> *this,Model *model,Json *source)

{
  ulong uVar1;
  element_type *this_00;
  Ref<anurbs::Polyline<2L>_> local_c8;
  shared_ptr<anurbs::Polyline<2L>_> local_b8;
  undefined1 local_a8 [32];
  undefined1 local_88 [24];
  Ref<anurbs::Polyline<2L>_> ref;
  undefined1 local_58 [8];
  undefined1 local_50 [8];
  Pointer<anurbs::Polyline<2L>_> data;
  string key;
  Json *source_local;
  Model *model_local;
  TypeEntry<anurbs::Polyline<2L>,_anurbs::Model> *this_local;
  
  key_from_json((string *)
                &data.super___shared_ptr<anurbs::Polyline<2L>,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount,source);
  Polyline<2L>::load((Polyline<2L> *)local_58,model,source);
  std::shared_ptr<anurbs::Polyline<2l>>::
  shared_ptr<anurbs::Polyline<2l>,std::default_delete<anurbs::Polyline<2l>>,void>
            ((shared_ptr<anurbs::Polyline<2l>> *)local_50,
             (unique_ptr<anurbs::Polyline<2L>,_std::default_delete<anurbs::Polyline<2L>_>_> *)
             local_58);
  std::unique_ptr<anurbs::Polyline<2L>,_std::default_delete<anurbs::Polyline<2L>_>_>::~unique_ptr
            ((unique_ptr<anurbs::Polyline<2L>,_std::default_delete<anurbs::Polyline<2L>_>_> *)
             local_58);
  Ref<anurbs::Polyline<2L>_>::Ref((Ref<anurbs::Polyline<2L>_> *)(local_88 + 0x10));
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::shared_ptr<anurbs::Polyline<2L>_>::shared_ptr
              (&local_b8,(shared_ptr<anurbs::Polyline<2L>_> *)local_50);
    Model::add<anurbs::Polyline<2l>>
              ((Model *)local_a8,(string *)model,
               (Pointer<anurbs::Polyline<2L>_> *)
               &data.super___shared_ptr<anurbs::Polyline<2L>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    Ref<anurbs::Polyline<2L>_>::operator=
              ((Ref<anurbs::Polyline<2L>_> *)(local_88 + 0x10),
               (Ref<anurbs::Polyline<2L>_> *)local_a8);
    Ref<anurbs::Polyline<2L>_>::~Ref((Ref<anurbs::Polyline<2L>_> *)local_a8);
    std::shared_ptr<anurbs::Polyline<2L>_>::~shared_ptr(&local_b8);
  }
  else {
    std::shared_ptr<anurbs::Polyline<2L>_>::shared_ptr
              ((shared_ptr<anurbs::Polyline<2L>_> *)(local_a8 + 0x10),
               (shared_ptr<anurbs::Polyline<2L>_> *)local_50);
    Model::add<anurbs::Polyline<2l>>((Model *)local_88,(Pointer<anurbs::Polyline<2L>_> *)model);
    Ref<anurbs::Polyline<2L>_>::operator=
              ((Ref<anurbs::Polyline<2L>_> *)(local_88 + 0x10),
               (Ref<anurbs::Polyline<2L>_> *)local_88);
    Ref<anurbs::Polyline<2L>_>::~Ref((Ref<anurbs::Polyline<2L>_> *)local_88);
    std::shared_ptr<anurbs::Polyline<2L>_>::~shared_ptr
              ((shared_ptr<anurbs::Polyline<2L>_> *)(local_a8 + 0x10));
  }
  Ref<anurbs::Polyline<2L>_>::attributes(&local_c8);
  this_00 = std::__shared_ptr_access<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&local_c8);
  Attributes::
  load<anurbs::Model,nlohmann::basic_json<anurbs::FiFoMap,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
            (this_00,model,source);
  std::shared_ptr<anurbs::Attributes>::~shared_ptr((shared_ptr<anurbs::Attributes> *)&local_c8);
  Ref<anurbs::Polyline<2L>_>::~Ref((Ref<anurbs::Polyline<2L>_> *)(local_88 + 0x10));
  std::shared_ptr<anurbs::Polyline<2L>_>::~shared_ptr((shared_ptr<anurbs::Polyline<2L>_> *)local_50)
  ;
  std::__cxx11::string::~string
            ((string *)
             &data.super___shared_ptr<anurbs::Polyline<2L>,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return true;
}

Assistant:

bool load(TModel& model, const Json& source) override
    {
        const auto key = key_from_json(source);

        Pointer<TData> data = TData::load(model, source);

        Ref<TData> ref;

        if (key.empty()) {
            ref = model.template add<TData>(data);
        } else {
            ref = model.template add<TData>(key, data);
        }

        ref.attributes()->load(model, source);

        return true;
    }